

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O3

btScalar __thiscall
btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup
          (btSequentialImpulseConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifoldPtr,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btContactSolverInfo *infoGlobal,btIDebugDraw *debugDrawer)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  uint uVar14;
  uint uVar15;
  btSolverBody *pbVar16;
  btRigidBody *pbVar17;
  btTypedConstraint *pbVar18;
  btConstraintInfo1 *ptr;
  undefined4 *puVar19;
  btSolverConstraint *ptr_00;
  btRigidBody *body;
  btRigidBody *pbVar20;
  int *piVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  btConstraintInfo1 *pbVar29;
  btSolverConstraint *pbVar30;
  anon_union_8_3_f9adb342_for_btSolverConstraint_15 *paVar31;
  int *piVar32;
  int iVar33;
  long *plVar34;
  long lVar35;
  ulong uVar36;
  float fVar37;
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  btScalar bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  btScalar bVar49;
  btScalar bVar50;
  undefined1 auVar51 [16];
  btScalar bVar52;
  btScalar bVar53;
  btScalar bVar54;
  btScalar bVar55;
  btScalar bVar56;
  float fVar57;
  btScalar bVar58;
  btScalar bVar59;
  btVector3 bVar60;
  btConstraintInfo2 info2;
  btSolverBody *local_208;
  float local_128;
  btScalar local_124;
  btVector3 *local_120;
  btSolverConstraint *local_118;
  btVector3 *pbStack_110;
  btVector3 *local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  btScalar *local_f8;
  btScalar *pbStack_f0;
  btScalar *local_e8;
  btScalar *local_e0;
  int local_d0;
  float local_cc;
  
  this->m_fixedBodyId = -1;
  CProfileManager::Start_Profile("solveGroupCacheFriendlySetup");
  this->m_maxOverrideNumSolverIterations = 0;
  if (0 < numBodies) {
    uVar27 = 0;
    do {
      bodies[uVar27]->m_companionId = -1;
      uVar27 = uVar27 + 1;
    } while ((uint)numBodies != uVar27);
  }
  iVar33 = (this->m_tmpSolverBodyPool).m_capacity;
  if (iVar33 <= numBodies) {
    iVar33 = numBodies + 1;
    if (iVar33 == 0) {
      local_208 = (btSolverBody *)0x0;
    }
    else {
      local_208 = (btSolverBody *)btAlignedAllocInternal((long)iVar33 * 0xf8,0x10);
    }
    lVar28 = (long)(this->m_tmpSolverBodyPool).m_size;
    if (0 < lVar28) {
      lVar35 = 0;
      do {
        puVar2 = (undefined8 *)
                 ((long)(((this->m_tmpSolverBodyPool).m_data)->m_worldTransform).m_basis.m_el[0].
                        m_floats + lVar35);
        uVar13 = puVar2[1];
        puVar1 = (undefined8 *)
                 ((long)(local_208->m_worldTransform).m_basis.m_el[0].m_floats + lVar35);
        *puVar1 = *puVar2;
        puVar1[1] = uVar13;
        uVar13 = puVar2[3];
        puVar1 = (undefined8 *)
                 ((long)(local_208->m_worldTransform).m_basis.m_el[1].m_floats + lVar35);
        *puVar1 = puVar2[2];
        puVar1[1] = uVar13;
        uVar13 = puVar2[5];
        puVar1 = (undefined8 *)
                 ((long)(local_208->m_worldTransform).m_basis.m_el[2].m_floats + lVar35);
        *puVar1 = puVar2[4];
        puVar1[1] = uVar13;
        uVar13 = puVar2[7];
        puVar1 = (undefined8 *)((long)(local_208->m_worldTransform).m_origin.m_floats + lVar35);
        *puVar1 = puVar2[6];
        puVar1[1] = uVar13;
        memcpy((void *)((long)(local_208->m_deltaLinearVelocity).m_floats + lVar35),puVar2 + 8,0xb8)
        ;
        lVar35 = lVar35 + 0xf8;
      } while (lVar28 * 0xf8 - lVar35 != 0);
    }
    pbVar16 = (this->m_tmpSolverBodyPool).m_data;
    if ((pbVar16 != (btSolverBody *)0x0) && ((this->m_tmpSolverBodyPool).m_ownsMemory == true)) {
      btAlignedFreeInternal(pbVar16);
    }
    (this->m_tmpSolverBodyPool).m_ownsMemory = true;
    (this->m_tmpSolverBodyPool).m_data = local_208;
    (this->m_tmpSolverBodyPool).m_capacity = iVar33;
  }
  memset(&local_128,0,0xf8);
  lVar28 = (long)(this->m_tmpSolverBodyPool).m_size;
  if (lVar28 < 0) {
    if (iVar33 < 0) {
      pbVar16 = (this->m_tmpSolverBodyPool).m_data;
      if ((pbVar16 != (btSolverBody *)0x0) && ((this->m_tmpSolverBodyPool).m_ownsMemory == true)) {
        btAlignedFreeInternal(pbVar16);
      }
      (this->m_tmpSolverBodyPool).m_ownsMemory = true;
      (this->m_tmpSolverBodyPool).m_data = (btSolverBody *)0x0;
      (this->m_tmpSolverBodyPool).m_capacity = 0;
    }
    lVar35 = lVar28 * 0xf8 + 0x40;
    do {
      pbVar16 = (this->m_tmpSolverBodyPool).m_data;
      puVar2 = (undefined8 *)((long)(&pbVar16->m_worldTransform + -1) + lVar35);
      *puVar2 = 0;
      puVar2[1] = 0;
      plVar34 = (long *)((long)(&(pbVar16->m_worldTransform).m_basis + -1) + lVar35);
      *plVar34 = (long)local_118;
      plVar34[1] = (long)pbStack_110;
      plVar34 = (long *)((long)((pbVar16->m_worldTransform).m_basis.m_el + -2) + lVar35);
      *plVar34 = (long)local_108;
      plVar34[1] = CONCAT44(uStack_fc,uStack_100);
      plVar34 = (long *)((long)((pbVar16->m_worldTransform).m_basis.m_el + -1) + lVar35);
      *plVar34 = (long)local_f8;
      plVar34[1] = (long)pbStack_f0;
      memcpy((void *)((long)(pbVar16->m_worldTransform).m_basis.m_el[0].m_floats + lVar35),&local_e8
             ,0xb8);
      lVar35 = lVar35 + 0xf8;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 0);
  }
  (this->m_tmpSolverBodyPool).m_size = 0;
  if (0 < numBodies) {
    uVar27 = 0;
    do {
      iVar33 = getOrInitSolverBody(this,bodies[uVar27],
                                   (infoGlobal->super_btContactSolverInfoData).m_timeStep);
      pbVar17 = (btRigidBody *)bodies[uVar27];
      if (((pbVar17 != (btRigidBody *)0x0) &&
          (((pbVar17->super_btCollisionObject).m_internalType & 2U) != 0)) &&
         ((pbVar17->m_inverseMass != 0.0 || (NAN(pbVar17->m_inverseMass))))) {
        pbVar16 = (this->m_tmpSolverBodyPool).m_data;
        uVar22 = pbVar17->m_rigidbodyFlags;
        if ((uVar22 & 2) != 0) {
          bVar60 = btRigidBody::computeGyroscopicForceExplicit
                             (pbVar17,(infoGlobal->super_btContactSolverInfoData).
                                      m_maxGyroscopicForce);
          fVar37 = bVar60.m_floats[0];
          fVar41 = bVar60.m_floats[1];
          fVar3 = *(float *)&pbVar17->field_0x164;
          fVar4 = *(float *)&pbVar17->field_0x154;
          fVar5 = *(float *)&pbVar17->field_0x174;
          fVar42 = bVar60.m_floats[2];
          fVar6 = (infoGlobal->super_btContactSolverInfoData).m_timeStep;
          uVar13 = *(undefined8 *)pbVar16[iVar33].m_externalTorqueImpulse.m_floats;
          *(ulong *)pbVar16[iVar33].m_externalTorqueImpulse.m_floats =
               CONCAT44((float)((ulong)uVar13 >> 0x20) -
                        fVar6 * (fVar42 * (float)((ulong)*(undefined8 *)&pbVar17->field_0x16c >>
                                                 0x20) +
                                fVar37 * *(float *)&pbVar17->field_0x150 +
                                (float)((ulong)*(undefined8 *)&pbVar17->field_0x15c >> 0x20) *
                                fVar41),
                        (float)uVar13 -
                        fVar6 * (fVar42 * (float)*(undefined8 *)&pbVar17->field_0x16c +
                                fVar37 * *(float *)&(pbVar17->super_btCollisionObject).field_0x14c +
                                (float)*(undefined8 *)&pbVar17->field_0x15c * fVar41));
          pbVar16[iVar33].m_externalTorqueImpulse.m_floats[2] =
               pbVar16[iVar33].m_externalTorqueImpulse.m_floats[2] -
               (fVar5 * fVar42 + fVar4 * fVar37 + fVar3 * fVar41) * fVar6;
          uVar22 = pbVar17->m_rigidbodyFlags;
        }
        if ((uVar22 & 4) != 0) {
          bVar60 = btRigidBody::computeGyroscopicImpulseImplicit_World
                             (pbVar17,(infoGlobal->super_btContactSolverInfoData).m_timeStep);
          fVar3 = pbVar16[iVar33].m_externalTorqueImpulse.m_floats[1];
          pbVar16[iVar33].m_externalTorqueImpulse.m_floats[0] =
               bVar60.m_floats[0] + pbVar16[iVar33].m_externalTorqueImpulse.m_floats[0];
          pbVar16[iVar33].m_externalTorqueImpulse.m_floats[1] = bVar60.m_floats[1] + fVar3;
          pbVar16[iVar33].m_externalTorqueImpulse.m_floats[2] =
               bVar60.m_floats[2] + pbVar16[iVar33].m_externalTorqueImpulse.m_floats[2];
          uVar22 = pbVar17->m_rigidbodyFlags;
        }
        if ((uVar22 & 8) != 0) {
          bVar60 = btRigidBody::computeGyroscopicImpulseImplicit_Body
                             (pbVar17,(infoGlobal->super_btContactSolverInfoData).m_timeStep);
          fVar3 = pbVar16[iVar33].m_externalTorqueImpulse.m_floats[1];
          pbVar16[iVar33].m_externalTorqueImpulse.m_floats[0] =
               bVar60.m_floats[0] + pbVar16[iVar33].m_externalTorqueImpulse.m_floats[0];
          pbVar16[iVar33].m_externalTorqueImpulse.m_floats[1] = bVar60.m_floats[1] + fVar3;
          pbVar16[iVar33].m_externalTorqueImpulse.m_floats[2] =
               bVar60.m_floats[2] + pbVar16[iVar33].m_externalTorqueImpulse.m_floats[2];
        }
      }
      uVar27 = uVar27 + 1;
    } while ((uint)numBodies != uVar27);
  }
  uVar27 = (ulong)(uint)numConstraints;
  if (0 < numConstraints) {
    uVar36 = 0;
    do {
      pbVar18 = constraints[uVar36];
      (*pbVar18->_vptr_btTypedConstraint[2])(pbVar18);
      pbVar18->m_appliedImpulse = 0.0;
      uVar36 = uVar36 + 1;
    } while (uVar27 != uVar36);
  }
  uVar22 = (this->m_tmpConstraintSizesPool).m_size;
  if (((int)uVar22 < numConstraints) &&
     ((this->m_tmpConstraintSizesPool).m_capacity < numConstraints)) {
    if (numConstraints == 0) {
      pbVar29 = (btConstraintInfo1 *)0x0;
    }
    else {
      pbVar29 = (btConstraintInfo1 *)btAlignedAllocInternal((long)numConstraints << 3,0x10);
      uVar22 = (this->m_tmpConstraintSizesPool).m_size;
    }
    if (0 < (int)uVar22) {
      uVar36 = 0;
      do {
        pbVar29[uVar36] = (this->m_tmpConstraintSizesPool).m_data[uVar36];
        uVar36 = uVar36 + 1;
      } while (uVar22 != uVar36);
    }
    ptr = (this->m_tmpConstraintSizesPool).m_data;
    if ((ptr != (btConstraintInfo1 *)0x0) && ((this->m_tmpConstraintSizesPool).m_ownsMemory == true)
       ) {
      btAlignedFreeInternal(ptr);
    }
    (this->m_tmpConstraintSizesPool).m_ownsMemory = true;
    (this->m_tmpConstraintSizesPool).m_data = pbVar29;
    (this->m_tmpConstraintSizesPool).m_capacity = numConstraints;
  }
  (this->m_tmpConstraintSizesPool).m_size = numConstraints;
  if (numConstraints < 1) {
    iVar33 = 0;
  }
  else {
    lVar28 = 0;
    iVar33 = 0;
    do {
      pbVar29 = (this->m_tmpConstraintSizesPool).m_data;
      plVar34 = *(long **)((long)constraints + lVar28);
      puVar19 = (undefined4 *)plVar34[8];
      if (puVar19 != (undefined4 *)0x0) {
        puVar19[0xc] = 0;
        puVar19[0xd] = 0;
        puVar19[0xe] = 0;
        puVar19[0xf] = 0;
        puVar19[8] = 0;
        puVar19[9] = 0;
        puVar19[10] = 0;
        puVar19[0xb] = 0;
        puVar19[4] = 0;
        puVar19[5] = 0;
        puVar19[6] = 0;
        puVar19[7] = 0;
        *puVar19 = 0;
        puVar19[1] = 0;
        puVar19[2] = 0;
        puVar19[3] = 0;
        plVar34 = *(long **)((long)constraints + lVar28);
      }
      if (*(char *)((long)plVar34 + 0x1c) == '\x01') {
        (**(code **)(*plVar34 + 0x20))();
        iVar23 = *(int *)((long)&pbVar29->m_numConstraintRows + lVar28);
      }
      else {
        *(undefined8 *)((long)&pbVar29->m_numConstraintRows + lVar28) = 0;
        iVar23 = 0;
      }
      iVar33 = iVar33 + iVar23;
      lVar28 = lVar28 + 8;
    } while (uVar27 * 8 - lVar28 != 0);
  }
  uVar22 = (this->m_tmpSolverNonContactConstraintPool).m_size;
  if (((int)uVar22 < iVar33) && ((this->m_tmpSolverNonContactConstraintPool).m_capacity < iVar33)) {
    if (iVar33 == 0) {
      pbVar30 = (btSolverConstraint *)0x0;
    }
    else {
      pbVar30 = (btSolverConstraint *)btAlignedAllocInternal((long)iVar33 * 0xa0,0x10);
      uVar22 = (this->m_tmpSolverNonContactConstraintPool).m_size;
    }
    if (0 < (int)uVar22) {
      lVar28 = 0;
      do {
        memcpy((void *)((long)(pbVar30->m_relpos1CrossNormal).m_floats + lVar28),
               (void *)((long)(((this->m_tmpSolverNonContactConstraintPool).m_data)->
                              m_relpos1CrossNormal).m_floats + lVar28),0xa0);
        lVar28 = lVar28 + 0xa0;
      } while ((ulong)uVar22 * 0xa0 != lVar28);
    }
    ptr_00 = (this->m_tmpSolverNonContactConstraintPool).m_data;
    if ((ptr_00 != (btSolverConstraint *)0x0) &&
       ((this->m_tmpSolverNonContactConstraintPool).m_ownsMemory == true)) {
      btAlignedFreeInternal(ptr_00);
    }
    (this->m_tmpSolverNonContactConstraintPool).m_ownsMemory = true;
    (this->m_tmpSolverNonContactConstraintPool).m_data = pbVar30;
    (this->m_tmpSolverNonContactConstraintPool).m_capacity = iVar33;
  }
  (this->m_tmpSolverNonContactConstraintPool).m_size = iVar33;
  if (0 < numConstraints) {
    pbVar29 = (this->m_tmpConstraintSizesPool).m_data;
    uVar36 = 0;
    iVar33 = 0;
    do {
      if (pbVar29[uVar36].m_numConstraintRows == 0) {
        iVar23 = 0;
      }
      else {
        pbVar30 = (this->m_tmpSolverNonContactConstraintPool).m_data;
        pbVar18 = constraints[uVar36];
        pbVar17 = pbVar18->m_rbA;
        body = pbVar18->m_rbB;
        iVar24 = getOrInitSolverBody(this,&pbVar17->super_btCollisionObject,
                                     (infoGlobal->super_btContactSolverInfoData).m_timeStep);
        iVar25 = getOrInitSolverBody(this,&body->super_btCollisionObject,
                                     (infoGlobal->super_btContactSolverInfoData).m_timeStep);
        iVar23 = pbVar18->m_overrideNumSolverIterations;
        if (iVar23 < 1) {
          iVar23 = (infoGlobal->super_btContactSolverInfoData).m_numIterations;
        }
        if (this->m_maxOverrideNumSolverIterations < iVar23) {
          this->m_maxOverrideNumSolverIterations = iVar23;
        }
        pbVar16 = (this->m_tmpSolverBodyPool).m_data;
        if (0 < pbVar29[uVar36].m_numConstraintRows) {
          piVar32 = &pbVar30[iVar33].m_solverBodyIdB;
          lVar28 = 0;
          do {
            memset((btSolverConstraint *)(piVar32 + -0x27),0,0x98);
            *(undefined8 *)(piVar32 + -9) = 0x7f7fffffff7fffff;
            piVar32[-0xf] = 0;
            piVar32[-1] = iVar24;
            *piVar32 = iVar25;
            piVar32[-3] = iVar23;
            lVar28 = lVar28 + 1;
            piVar32 = piVar32 + 0x28;
          } while (lVar28 < pbVar29[uVar36].m_numConstraintRows);
        }
        pbVar16[iVar24].m_deltaAngularVelocity.m_floats[0] = 0.0;
        pbVar16[iVar24].m_deltaAngularVelocity.m_floats[1] = 0.0;
        pbVar16[iVar24].m_deltaAngularVelocity.m_floats[2] = 0.0;
        pbVar16[iVar24].m_deltaAngularVelocity.m_floats[3] = 0.0;
        pbVar16[iVar24].m_deltaLinearVelocity.m_floats[0] = 0.0;
        pbVar16[iVar24].m_deltaLinearVelocity.m_floats[1] = 0.0;
        pbVar16[iVar24].m_deltaLinearVelocity.m_floats[2] = 0.0;
        pbVar16[iVar24].m_deltaLinearVelocity.m_floats[3] = 0.0;
        pbVar16[iVar24].m_pushVelocity.m_floats[0] = 0.0;
        pbVar16[iVar24].m_pushVelocity.m_floats[1] = 0.0;
        pbVar16[iVar24].m_pushVelocity.m_floats[2] = 0.0;
        pbVar16[iVar24].m_pushVelocity.m_floats[3] = 0.0;
        pbVar16[iVar24].m_turnVelocity.m_floats[0] = 0.0;
        pbVar16[iVar24].m_turnVelocity.m_floats[1] = 0.0;
        pbVar16[iVar24].m_turnVelocity.m_floats[2] = 0.0;
        pbVar16[iVar24].m_turnVelocity.m_floats[3] = 0.0;
        pbVar16[iVar25].m_deltaAngularVelocity.m_floats[0] = 0.0;
        pbVar16[iVar25].m_deltaAngularVelocity.m_floats[1] = 0.0;
        pbVar16[iVar25].m_deltaAngularVelocity.m_floats[2] = 0.0;
        pbVar16[iVar25].m_deltaAngularVelocity.m_floats[3] = 0.0;
        pbVar16[iVar25].m_deltaLinearVelocity.m_floats[0] = 0.0;
        pbVar16[iVar25].m_deltaLinearVelocity.m_floats[1] = 0.0;
        pbVar16[iVar25].m_deltaLinearVelocity.m_floats[2] = 0.0;
        pbVar16[iVar25].m_deltaLinearVelocity.m_floats[3] = 0.0;
        pbVar16[iVar25].m_pushVelocity.m_floats[0] = 0.0;
        pbVar16[iVar25].m_pushVelocity.m_floats[1] = 0.0;
        pbVar16[iVar25].m_pushVelocity.m_floats[2] = 0.0;
        pbVar16[iVar25].m_pushVelocity.m_floats[3] = 0.0;
        pbVar16[iVar25].m_turnVelocity.m_floats[0] = 0.0;
        pbVar16[iVar25].m_turnVelocity.m_floats[1] = 0.0;
        pbVar16[iVar25].m_turnVelocity.m_floats[2] = 0.0;
        pbVar16[iVar25].m_turnVelocity.m_floats[3] = 0.0;
        local_128 = 1.0 / (infoGlobal->super_btContactSolverInfoData).m_timeStep;
        local_118 = pbVar30 + iVar33;
        local_124 = (infoGlobal->super_btContactSolverInfoData).m_erp;
        local_120 = &local_118->m_contactNormal1;
        pbStack_110 = &local_118->m_contactNormal2;
        local_108 = &local_118->m_relpos2CrossNormal;
        uStack_100 = 0x28;
        local_f8 = &local_118->m_rhs;
        pbStack_f0 = &local_118->m_cfm;
        local_118->m_cfm = (infoGlobal->super_btContactSolverInfoData).m_globalCfm;
        local_cc = (infoGlobal->super_btContactSolverInfoData).m_damping;
        local_e8 = &local_118->m_lowerLimit;
        local_e0 = &local_118->m_upperLimit;
        local_d0 = (infoGlobal->super_btContactSolverInfoData).m_numIterations;
        (*constraints[uVar36]->_vptr_btTypedConstraint[5])(constraints[uVar36],&local_128);
        if (0 < pbVar29[uVar36].m_numConstraintRows) {
          paVar31 = &pbVar30[iVar33].field_15;
          lVar28 = 0;
          do {
            fVar3 = constraints[uVar36]->m_breakingImpulseThreshold;
            if (fVar3 <= *(btScalar *)((long)paVar31 + -0xc)) {
              *(float *)((long)paVar31 + -0xc) = fVar3;
            }
            if (paVar31[-2].m_unusedPadding4 <= -fVar3) {
              paVar31[-2].m_unusedPadding4 = -fVar3;
            }
            paVar31->m_originalContactPoint = pbVar18;
            pbVar20 = pbVar18->m_rbA;
            fVar3 = (((btSolverConstraint *)(paVar31 + -0x11))->m_relpos1CrossNormal).m_floats[0];
            fVar4 = *(btScalar *)((long)paVar31 + -0x84);
            fVar5 = paVar31[-0x10].m_unusedPadding4;
            uVar13 = *(undefined8 *)(pbVar20->m_angularFactor).m_floats;
            auVar44._0_4_ =
                 (float)uVar13 *
                 (fVar5 * *(float *)&pbVar20->field_0x154 +
                 fVar3 * *(float *)&(pbVar20->super_btCollisionObject).field_0x14c +
                 *(float *)&pbVar20->field_0x150 * fVar4);
            auVar44._4_4_ =
                 (float)((ulong)uVar13 >> 0x20) *
                 (fVar5 * *(float *)&pbVar20->field_0x164 +
                 fVar3 * *(float *)&pbVar20->field_0x15c + *(float *)&pbVar20->field_0x160 * fVar4);
            auVar44._8_4_ =
                 (*(float *)&pbVar20->field_0x174 * fVar5 +
                 *(float *)&pbVar20->field_0x16c * fVar3 + *(float *)&pbVar20->field_0x170 * fVar4)
                 * (pbVar20->m_angularFactor).m_floats[2];
            auVar44._12_4_ = 0;
            *(undefined1 (*) [16])((btVector3 *)(paVar31 + -9))->m_floats = auVar44;
            pbVar20 = pbVar18->m_rbB;
            fVar6 = ((btVector3 *)(paVar31 + -0xd))->m_floats[0];
            fVar37 = *(btScalar *)((long)paVar31 + -100);
            fVar41 = paVar31[-0xc].m_unusedPadding4;
            uVar13 = *(undefined8 *)(pbVar20->m_angularFactor).m_floats;
            auVar51._0_4_ =
                 (float)uVar13 *
                 (fVar41 * *(float *)&pbVar20->field_0x154 +
                 fVar6 * *(float *)&(pbVar20->super_btCollisionObject).field_0x14c +
                 *(float *)&pbVar20->field_0x150 * fVar37);
            auVar51._4_4_ =
                 (float)((ulong)uVar13 >> 0x20) *
                 (fVar41 * *(float *)&pbVar20->field_0x164 +
                 fVar6 * *(float *)&pbVar20->field_0x15c + *(float *)&pbVar20->field_0x160 * fVar37)
            ;
            auVar51._8_4_ =
                 (*(float *)&pbVar20->field_0x174 * fVar41 +
                 *(float *)&pbVar20->field_0x16c * fVar6 + *(float *)&pbVar20->field_0x170 * fVar37)
                 * (pbVar20->m_angularFactor).m_floats[2];
            auVar51._12_4_ = 0;
            *(undefined1 (*) [16])((btVector3 *)(paVar31 + -7))->m_floats = auVar51;
            fVar42 = pbVar17->m_inverseMass;
            fVar7 = ((btVector3 *)(paVar31 + -0xf))->m_floats[0];
            fVar8 = *(btScalar *)((long)paVar31 + -0x74);
            fVar9 = paVar31[-0xe].m_unusedPadding4;
            fVar48 = body->m_inverseMass;
            fVar10 = ((btVector3 *)(paVar31 + -0xb))->m_floats[0];
            fVar11 = *(btScalar *)((long)paVar31 + -0x54);
            fVar12 = paVar31[-10].m_unusedPadding4;
            fVar42 = (*(float *)&body->field_0x174 * fVar41 +
                     *(float *)&body->field_0x16c * fVar6 + *(float *)&body->field_0x170 * fVar37) *
                     fVar41 + (*(float *)&body->field_0x154 * fVar41 +
                              *(float *)&(body->super_btCollisionObject).field_0x14c * fVar6 +
                              *(float *)&body->field_0x150 * fVar37) * fVar6 +
                              (*(float *)&body->field_0x164 * fVar41 +
                              *(float *)&body->field_0x15c * fVar6 +
                              *(float *)&body->field_0x160 * fVar37) * fVar37 +
                     fVar48 * fVar12 * fVar12 + fVar48 * fVar10 * fVar10 + fVar48 * fVar11 * fVar11
                     + fVar5 * (*(float *)&pbVar17->field_0x174 * fVar5 +
                               *(float *)&pbVar17->field_0x16c * fVar3 +
                               *(float *)&pbVar17->field_0x170 * fVar4) +
                       fVar3 * (*(float *)&pbVar17->field_0x154 * fVar5 +
                               *(float *)&(pbVar17->super_btCollisionObject).field_0x14c * fVar3 +
                               *(float *)&pbVar17->field_0x150 * fVar4) +
                       fVar4 * (*(float *)&pbVar17->field_0x164 * fVar5 +
                               *(float *)&pbVar17->field_0x15c * fVar3 +
                               *(float *)&pbVar17->field_0x160 * fVar4) +
                       fVar9 * fVar42 * fVar9 + fVar7 * fVar42 * fVar7 + fVar8 * fVar42 * fVar8;
            fVar57 = (float)(-(uint)(1.1920929e-07 < ABS(fVar42)) & (uint)(1.0 / fVar42));
            *(float *)((long)paVar31 + -0x1c) = fVar57;
            bVar59 = 0.0;
            bVar43 = 0.0;
            bVar58 = 0.0;
            fVar42 = 0.0;
            bVar50 = 0.0;
            bVar52 = 0.0;
            fVar48 = 0.0;
            if (pbVar16[iVar24].m_originalBody != (btRigidBody *)0x0) {
              fVar42 = pbVar16[iVar24].m_externalForceImpulse.m_floats[0];
              bVar58 = pbVar16[iVar24].m_externalForceImpulse.m_floats[1];
              bVar43 = pbVar16[iVar24].m_externalForceImpulse.m_floats[2];
              bVar50 = pbVar16[iVar24].m_externalTorqueImpulse.m_floats[0];
              bVar52 = pbVar16[iVar24].m_externalTorqueImpulse.m_floats[1];
              fVar48 = pbVar16[iVar24].m_externalTorqueImpulse.m_floats[2];
            }
            bVar49 = 0.0;
            bVar53 = 0.0;
            bVar55 = 0.0;
            bVar54 = 0.0;
            bVar56 = 0.0;
            if (pbVar16[iVar25].m_originalBody != (btRigidBody *)0x0) {
              bVar53 = pbVar16[iVar25].m_externalForceImpulse.m_floats[0];
              bVar49 = pbVar16[iVar25].m_externalForceImpulse.m_floats[1];
              bVar59 = pbVar16[iVar25].m_externalForceImpulse.m_floats[2];
              bVar56 = pbVar16[iVar25].m_externalTorqueImpulse.m_floats[0];
              bVar54 = pbVar16[iVar25].m_externalTorqueImpulse.m_floats[1];
              bVar55 = pbVar16[iVar25].m_externalTorqueImpulse.m_floats[2];
            }
            paVar31[-3].m_unusedPadding4 =
                 fVar57 * (0.0 - (fVar41 * (bVar55 + (body->m_angularVelocity).m_floats[2]) +
                                  fVar6 * (bVar56 + (body->m_angularVelocity).m_floats[0]) +
                                  fVar37 * (bVar54 + (body->m_angularVelocity).m_floats[1]) +
                                  fVar12 * (bVar59 + (body->m_linearVelocity).m_floats[2]) +
                                  fVar10 * (bVar53 + (body->m_linearVelocity).m_floats[0]) +
                                  fVar11 * (bVar49 + (body->m_linearVelocity).m_floats[1]) +
                                 fVar5 * (fVar48 + (pbVar17->m_angularVelocity).m_floats[2]) +
                                 fVar3 * (bVar50 + (pbVar17->m_angularVelocity).m_floats[0]) +
                                 fVar4 * (bVar52 + (pbVar17->m_angularVelocity).m_floats[1]) +
                                 fVar9 * (bVar43 + (pbVar17->m_linearVelocity).m_floats[2]) +
                                 fVar7 * (fVar42 + (pbVar17->m_linearVelocity).m_floats[0]) +
                                 fVar8 * (bVar58 + (pbVar17->m_linearVelocity).m_floats[1])) *
                                 local_cc) + paVar31[-3].m_unusedPadding4 * fVar57;
            *(btScalar *)((long)paVar31 + -0x24) = 0.0;
            lVar28 = lVar28 + 1;
            paVar31 = paVar31 + 0x14;
          } while (lVar28 < pbVar29[uVar36].m_numConstraintRows);
        }
        pbVar29 = (this->m_tmpConstraintSizesPool).m_data;
        iVar23 = pbVar29[uVar36].m_numConstraintRows;
      }
      iVar33 = iVar33 + iVar23;
      uVar36 = uVar36 + 1;
    } while (uVar36 != uVar27);
  }
  (*(this->super_btConstraintSolver)._vptr_btConstraintSolver[7])
            (this,manifoldPtr,(ulong)(uint)numManifolds,infoGlobal);
  uVar22 = (this->m_tmpSolverContactConstraintPool).m_size;
  uVar14 = (this->m_tmpSolverNonContactConstraintPool).m_size;
  uVar15 = (this->m_tmpSolverContactFrictionConstraintPool).m_size;
  uVar26 = (this->m_orderNonContactConstraintPool).m_size;
  if (((int)uVar26 < (int)uVar14) &&
     ((this->m_orderNonContactConstraintPool).m_capacity < (int)uVar14)) {
    if (uVar14 == 0) {
      piVar32 = (int *)0x0;
    }
    else {
      piVar32 = (int *)btAlignedAllocInternal((long)(int)uVar14 << 2,0x10);
      uVar26 = (this->m_orderNonContactConstraintPool).m_size;
    }
    piVar21 = (this->m_orderNonContactConstraintPool).m_data;
    if ((int)uVar26 < 1) {
      if (piVar21 != (int *)0x0) goto LAB_0019fb36;
    }
    else {
      uVar27 = 0;
      do {
        piVar32[uVar27] = piVar21[uVar27];
        uVar27 = uVar27 + 1;
      } while (uVar26 != uVar27);
LAB_0019fb36:
      if ((this->m_orderNonContactConstraintPool).m_ownsMemory == true) {
        btAlignedFreeInternal(piVar21);
      }
    }
    (this->m_orderNonContactConstraintPool).m_ownsMemory = true;
    (this->m_orderNonContactConstraintPool).m_data = piVar32;
    (this->m_orderNonContactConstraintPool).m_capacity = uVar14;
  }
  (this->m_orderNonContactConstraintPool).m_size = uVar14;
  if (((infoGlobal->super_btContactSolverInfoData).m_solverMode & 0x10) == 0) {
    uVar26 = (this->m_orderTmpConstraintPool).m_size;
    if (((int)uVar26 < (int)uVar22) && ((this->m_orderTmpConstraintPool).m_capacity < (int)uVar22))
    {
      if (uVar22 == 0) {
        piVar32 = (int *)0x0;
      }
      else {
        piVar32 = (int *)btAlignedAllocInternal((long)(int)uVar22 << 2,0x10);
        uVar26 = (this->m_orderTmpConstraintPool).m_size;
      }
      piVar21 = (this->m_orderTmpConstraintPool).m_data;
      if ((int)uVar26 < 1) {
        if (piVar21 != (int *)0x0) goto LAB_0019fc51;
      }
      else {
        uVar27 = 0;
        do {
          piVar32[uVar27] = piVar21[uVar27];
          uVar27 = uVar27 + 1;
        } while (uVar26 != uVar27);
LAB_0019fc51:
        if ((this->m_orderTmpConstraintPool).m_ownsMemory == true) {
          btAlignedFreeInternal(piVar21);
        }
      }
      (this->m_orderTmpConstraintPool).m_ownsMemory = true;
      (this->m_orderTmpConstraintPool).m_data = piVar32;
      (this->m_orderTmpConstraintPool).m_capacity = uVar22;
    }
    (this->m_orderTmpConstraintPool).m_size = uVar22;
  }
  else {
    iVar33 = uVar22 * 2;
    uVar26 = (this->m_orderTmpConstraintPool).m_size;
    if (((int)uVar26 < iVar33) && ((this->m_orderTmpConstraintPool).m_capacity < iVar33)) {
      if (uVar22 == 0) {
        piVar32 = (int *)0x0;
      }
      else {
        piVar32 = (int *)btAlignedAllocInternal((long)(int)uVar22 << 3,0x10);
        uVar26 = (this->m_orderTmpConstraintPool).m_size;
      }
      piVar21 = (this->m_orderTmpConstraintPool).m_data;
      if ((int)uVar26 < 1) {
        if (piVar21 != (int *)0x0) goto LAB_0019fc8a;
      }
      else {
        uVar27 = 0;
        do {
          piVar32[uVar27] = piVar21[uVar27];
          uVar27 = uVar27 + 1;
        } while (uVar26 != uVar27);
LAB_0019fc8a:
        if ((this->m_orderTmpConstraintPool).m_ownsMemory == true) {
          btAlignedFreeInternal(piVar21);
        }
      }
      (this->m_orderTmpConstraintPool).m_ownsMemory = true;
      (this->m_orderTmpConstraintPool).m_data = piVar32;
      (this->m_orderTmpConstraintPool).m_capacity = iVar33;
    }
    (this->m_orderTmpConstraintPool).m_size = iVar33;
  }
  uVar26 = (this->m_orderFrictionConstraintPool).m_size;
  if (((int)uVar15 <= (int)uVar26) ||
     ((int)uVar15 <= (this->m_orderFrictionConstraintPool).m_capacity)) goto LAB_0019fd4c;
  if (uVar15 == 0) {
    piVar32 = (int *)0x0;
  }
  else {
    piVar32 = (int *)btAlignedAllocInternal((long)(int)uVar15 << 2,0x10);
    uVar26 = (this->m_orderFrictionConstraintPool).m_size;
  }
  piVar21 = (this->m_orderFrictionConstraintPool).m_data;
  if ((int)uVar26 < 1) {
    if (piVar21 != (int *)0x0) goto LAB_0019fd22;
  }
  else {
    uVar27 = 0;
    do {
      piVar32[uVar27] = piVar21[uVar27];
      uVar27 = uVar27 + 1;
    } while (uVar26 != uVar27);
LAB_0019fd22:
    if ((this->m_orderFrictionConstraintPool).m_ownsMemory == true) {
      btAlignedFreeInternal(piVar21);
    }
  }
  (this->m_orderFrictionConstraintPool).m_ownsMemory = true;
  (this->m_orderFrictionConstraintPool).m_data = piVar32;
  (this->m_orderFrictionConstraintPool).m_capacity = uVar15;
LAB_0019fd4c:
  (this->m_orderFrictionConstraintPool).m_size = uVar15;
  auVar44 = _DAT_001ee270;
  if (0 < (int)uVar14) {
    piVar32 = (this->m_orderNonContactConstraintPool).m_data;
    lVar28 = (ulong)uVar14 - 1;
    auVar38._8_4_ = (int)lVar28;
    auVar38._0_8_ = lVar28;
    auVar38._12_4_ = (int)((ulong)lVar28 >> 0x20);
    uVar27 = 0;
    auVar38 = auVar38 ^ _DAT_001ee270;
    auVar45 = _DAT_001ee5d0;
    do {
      auVar51 = auVar45 ^ auVar44;
      if ((bool)(~(auVar51._4_4_ == auVar38._4_4_ && auVar38._0_4_ < auVar51._0_4_ ||
                  auVar38._4_4_ < auVar51._4_4_) & 1)) {
        piVar32[uVar27] = (int)uVar27;
      }
      if ((auVar51._12_4_ != auVar38._12_4_ || auVar51._8_4_ <= auVar38._8_4_) &&
          auVar51._12_4_ <= auVar38._12_4_) {
        piVar32[uVar27 + 1] = (int)uVar27 + 1;
      }
      uVar27 = uVar27 + 2;
      lVar28 = auVar45._8_8_;
      auVar45._0_8_ = auVar45._0_8_ + 2;
      auVar45._8_8_ = lVar28 + 2;
    } while ((uVar14 + 1 & 0xfffffffe) != uVar27);
  }
  auVar44 = _DAT_001ee270;
  if (0 < (int)uVar22) {
    piVar32 = (this->m_orderTmpConstraintPool).m_data;
    lVar28 = (ulong)uVar22 - 1;
    auVar39._8_4_ = (int)lVar28;
    auVar39._0_8_ = lVar28;
    auVar39._12_4_ = (int)((ulong)lVar28 >> 0x20);
    uVar27 = 0;
    auVar39 = auVar39 ^ _DAT_001ee270;
    auVar46 = _DAT_001ee5d0;
    do {
      auVar51 = auVar46 ^ auVar44;
      if ((bool)(~(auVar51._4_4_ == auVar39._4_4_ && auVar39._0_4_ < auVar51._0_4_ ||
                  auVar39._4_4_ < auVar51._4_4_) & 1)) {
        piVar32[uVar27] = (int)uVar27;
      }
      if ((auVar51._12_4_ != auVar39._12_4_ || auVar51._8_4_ <= auVar39._8_4_) &&
          auVar51._12_4_ <= auVar39._12_4_) {
        piVar32[uVar27 + 1] = (int)uVar27 + 1;
      }
      uVar27 = uVar27 + 2;
      lVar28 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + 2;
      auVar46._8_8_ = lVar28 + 2;
    } while ((uVar22 + 1 & 0xfffffffe) != uVar27);
  }
  auVar44 = _DAT_001ee270;
  if (0 < (int)uVar15) {
    piVar32 = (this->m_orderFrictionConstraintPool).m_data;
    lVar28 = (ulong)uVar15 - 1;
    auVar40._8_4_ = (int)lVar28;
    auVar40._0_8_ = lVar28;
    auVar40._12_4_ = (int)((ulong)lVar28 >> 0x20);
    uVar27 = 0;
    auVar40 = auVar40 ^ _DAT_001ee270;
    auVar47 = _DAT_001ee5d0;
    do {
      auVar51 = auVar47 ^ auVar44;
      if ((bool)(~(auVar51._4_4_ == auVar40._4_4_ && auVar40._0_4_ < auVar51._0_4_ ||
                  auVar40._4_4_ < auVar51._4_4_) & 1)) {
        piVar32[uVar27] = (int)uVar27;
      }
      if ((auVar51._12_4_ != auVar40._12_4_ || auVar51._8_4_ <= auVar40._8_4_) &&
          auVar51._12_4_ <= auVar40._12_4_) {
        piVar32[uVar27 + 1] = (int)uVar27 + 1;
      }
      uVar27 = uVar27 + 2;
      lVar28 = auVar47._8_8_;
      auVar47._0_8_ = auVar47._0_8_ + 2;
      auVar47._8_8_ = lVar28 + 2;
    } while ((uVar15 + 1 & 0xfffffffe) != uVar27);
  }
  CProfileManager::Stop_Profile();
  return 0.0;
}

Assistant:

btScalar btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup(btCollisionObject** bodies, int numBodies, btPersistentManifold** manifoldPtr, int numManifolds,btTypedConstraint** constraints,int numConstraints,const btContactSolverInfo& infoGlobal,btIDebugDraw* debugDrawer)
{
	m_fixedBodyId = -1;
	BT_PROFILE("solveGroupCacheFriendlySetup");
	(void)debugDrawer;

	m_maxOverrideNumSolverIterations = 0;

#ifdef BT_ADDITIONAL_DEBUG
	 //make sure that dynamic bodies exist for all (enabled) constraints
	for (int i=0;i<numConstraints;i++)
	{
		btTypedConstraint* constraint = constraints[i];
		if (constraint->isEnabled())
		{
			if (!constraint->getRigidBodyA().isStaticOrKinematicObject())
			{
				bool found=false;
				for (int b=0;b<numBodies;b++)
				{

					if (&constraint->getRigidBodyA()==bodies[b])
					{
						found = true;
						break;
					}
				}
				btAssert(found);
			}
			if (!constraint->getRigidBodyB().isStaticOrKinematicObject())
			{
				bool found=false;
				for (int b=0;b<numBodies;b++)
				{
					if (&constraint->getRigidBodyB()==bodies[b])
					{
						found = true;
						break;
					}
				}
				btAssert(found);
			}
		}
	}
    //make sure that dynamic bodies exist for all contact manifolds
    for (int i=0;i<numManifolds;i++)
    {
        if (!manifoldPtr[i]->getBody0()->isStaticOrKinematicObject())
        {
            bool found=false;
            for (int b=0;b<numBodies;b++)
            {

                if (manifoldPtr[i]->getBody0()==bodies[b])
                {
                    found = true;
                    break;
                }
            }
            btAssert(found);
        }
        if (!manifoldPtr[i]->getBody1()->isStaticOrKinematicObject())
        {
            bool found=false;
            for (int b=0;b<numBodies;b++)
            {
                if (manifoldPtr[i]->getBody1()==bodies[b])
                {
                    found = true;
                    break;
                }
            }
            btAssert(found);
        }
    }
#endif //BT_ADDITIONAL_DEBUG


	for (int i = 0; i < numBodies; i++)
	{
		bodies[i]->setCompanionId(-1);
	}


	m_tmpSolverBodyPool.reserve(numBodies+1);
	m_tmpSolverBodyPool.resize(0);

	//btSolverBody& fixedBody = m_tmpSolverBodyPool.expand();
    //initSolverBody(&fixedBody,0);

	//convert all bodies


	for (int i=0;i<numBodies;i++)
	{
		int bodyId = getOrInitSolverBody(*bodies[i],infoGlobal.m_timeStep);

		btRigidBody* body = btRigidBody::upcast(bodies[i]);
		if (body && body->getInvMass())
		{
			btSolverBody& solverBody = m_tmpSolverBodyPool[bodyId];
			btVector3 gyroForce (0,0,0);
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_EXPLICIT)
			{
				gyroForce = body->computeGyroscopicForceExplicit(infoGlobal.m_maxGyroscopicForce);
				solverBody.m_externalTorqueImpulse -= gyroForce*body->getInvInertiaTensorWorld()*infoGlobal.m_timeStep;
			}
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_IMPLICIT_WORLD)
			{
				gyroForce = body->computeGyroscopicImpulseImplicit_World(infoGlobal.m_timeStep);
				solverBody.m_externalTorqueImpulse += gyroForce;
			}
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_IMPLICIT_BODY)
			{
				gyroForce = body->computeGyroscopicImpulseImplicit_Body(infoGlobal.m_timeStep);
				solverBody.m_externalTorqueImpulse += gyroForce;

			}
			

		}
	}

	if (1)
	{
		int j;
		for (j=0;j<numConstraints;j++)
		{
			btTypedConstraint* constraint = constraints[j];
			constraint->buildJacobian();
			constraint->internalSetAppliedImpulse(0.0f);
		}
	}

	//btRigidBody* rb0=0,*rb1=0;

	//if (1)
	{
		{

			int totalNumRows = 0;
			int i;

			m_tmpConstraintSizesPool.resizeNoInitialize(numConstraints);
			//calculate the total number of contraint rows
			for (i=0;i<numConstraints;i++)
			{
				btTypedConstraint::btConstraintInfo1& info1 = m_tmpConstraintSizesPool[i];
				btJointFeedback* fb = constraints[i]->getJointFeedback();
				if (fb)
				{
					fb->m_appliedForceBodyA.setZero();
					fb->m_appliedTorqueBodyA.setZero();
					fb->m_appliedForceBodyB.setZero();
					fb->m_appliedTorqueBodyB.setZero();
				}

				if (constraints[i]->isEnabled())
				{
				}
				if (constraints[i]->isEnabled())
				{
					constraints[i]->getInfo1(&info1);
				} else
				{
					info1.m_numConstraintRows = 0;
					info1.nub = 0;
				}
				totalNumRows += info1.m_numConstraintRows;
			}
			m_tmpSolverNonContactConstraintPool.resizeNoInitialize(totalNumRows);


			///setup the btSolverConstraints
			int currentRow = 0;

			for (i=0;i<numConstraints;i++)
			{
				const btTypedConstraint::btConstraintInfo1& info1 = m_tmpConstraintSizesPool[i];

				if (info1.m_numConstraintRows)
				{
					btAssert(currentRow<totalNumRows);

					btSolverConstraint* currentConstraintRow = &m_tmpSolverNonContactConstraintPool[currentRow];
					btTypedConstraint* constraint = constraints[i];
					btRigidBody& rbA = constraint->getRigidBodyA();
					btRigidBody& rbB = constraint->getRigidBodyB();

					int solverBodyIdA = getOrInitSolverBody(rbA,infoGlobal.m_timeStep);
                    int solverBodyIdB = getOrInitSolverBody(rbB,infoGlobal.m_timeStep);

                    btSolverBody* bodyAPtr = &m_tmpSolverBodyPool[solverBodyIdA];
                    btSolverBody* bodyBPtr = &m_tmpSolverBodyPool[solverBodyIdB];




					int overrideNumSolverIterations = constraint->getOverrideNumSolverIterations() > 0 ? constraint->getOverrideNumSolverIterations() : infoGlobal.m_numIterations;
					if (overrideNumSolverIterations>m_maxOverrideNumSolverIterations)
						m_maxOverrideNumSolverIterations = overrideNumSolverIterations;


					int j;
					for ( j=0;j<info1.m_numConstraintRows;j++)
					{
						memset(&currentConstraintRow[j],0,sizeof(btSolverConstraint));
						currentConstraintRow[j].m_lowerLimit = -SIMD_INFINITY;
						currentConstraintRow[j].m_upperLimit = SIMD_INFINITY;
						currentConstraintRow[j].m_appliedImpulse = 0.f;
						currentConstraintRow[j].m_appliedPushImpulse = 0.f;
						currentConstraintRow[j].m_solverBodyIdA = solverBodyIdA;
						currentConstraintRow[j].m_solverBodyIdB = solverBodyIdB;
						currentConstraintRow[j].m_overrideNumSolverIterations = overrideNumSolverIterations;
					}

					bodyAPtr->internalGetDeltaLinearVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetDeltaAngularVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetPushVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetTurnVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetDeltaLinearVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetDeltaAngularVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetPushVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetTurnVelocity().setValue(0.f,0.f,0.f);


					btTypedConstraint::btConstraintInfo2 info2;
					info2.fps = 1.f/infoGlobal.m_timeStep;
					info2.erp = infoGlobal.m_erp;
					info2.m_J1linearAxis = currentConstraintRow->m_contactNormal1;
					info2.m_J1angularAxis = currentConstraintRow->m_relpos1CrossNormal;
					info2.m_J2linearAxis = currentConstraintRow->m_contactNormal2;
					info2.m_J2angularAxis = currentConstraintRow->m_relpos2CrossNormal;
					info2.rowskip = sizeof(btSolverConstraint)/sizeof(btScalar);//check this
					///the size of btSolverConstraint needs be a multiple of btScalar
		            btAssert(info2.rowskip*sizeof(btScalar)== sizeof(btSolverConstraint));
					info2.m_constraintError = &currentConstraintRow->m_rhs;
					currentConstraintRow->m_cfm = infoGlobal.m_globalCfm;
					info2.m_damping = infoGlobal.m_damping;
					info2.cfm = &currentConstraintRow->m_cfm;
					info2.m_lowerLimit = &currentConstraintRow->m_lowerLimit;
					info2.m_upperLimit = &currentConstraintRow->m_upperLimit;
					info2.m_numIterations = infoGlobal.m_numIterations;
					constraints[i]->getInfo2(&info2);

					///finalize the constraint setup
					for ( j=0;j<info1.m_numConstraintRows;j++)
					{
						btSolverConstraint& solverConstraint = currentConstraintRow[j];

						if (solverConstraint.m_upperLimit>=constraints[i]->getBreakingImpulseThreshold())
						{
							solverConstraint.m_upperLimit = constraints[i]->getBreakingImpulseThreshold();
						}

						if (solverConstraint.m_lowerLimit<=-constraints[i]->getBreakingImpulseThreshold())
						{
							solverConstraint.m_lowerLimit = -constraints[i]->getBreakingImpulseThreshold();
						}

						solverConstraint.m_originalContactPoint = constraint;

						{
							const btVector3& ftorqueAxis1 = solverConstraint.m_relpos1CrossNormal;
							solverConstraint.m_angularComponentA = constraint->getRigidBodyA().getInvInertiaTensorWorld()*ftorqueAxis1*constraint->getRigidBodyA().getAngularFactor();
						}
						{
							const btVector3& ftorqueAxis2 = solverConstraint.m_relpos2CrossNormal;
							solverConstraint.m_angularComponentB = constraint->getRigidBodyB().getInvInertiaTensorWorld()*ftorqueAxis2*constraint->getRigidBodyB().getAngularFactor();
						}

						{
							btVector3 iMJlA = solverConstraint.m_contactNormal1*rbA.getInvMass();
							btVector3 iMJaA = rbA.getInvInertiaTensorWorld()*solverConstraint.m_relpos1CrossNormal;
							btVector3 iMJlB = solverConstraint.m_contactNormal2*rbB.getInvMass();//sign of normal?
							btVector3 iMJaB = rbB.getInvInertiaTensorWorld()*solverConstraint.m_relpos2CrossNormal;

							btScalar sum = iMJlA.dot(solverConstraint.m_contactNormal1);
							sum += iMJaA.dot(solverConstraint.m_relpos1CrossNormal);
							sum += iMJlB.dot(solverConstraint.m_contactNormal2);
							sum += iMJaB.dot(solverConstraint.m_relpos2CrossNormal);
							btScalar fsum = btFabs(sum);
							btAssert(fsum > SIMD_EPSILON);
							solverConstraint.m_jacDiagABInv = fsum>SIMD_EPSILON?btScalar(1.)/sum : 0.f;
						}



						{
							btScalar rel_vel;
							btVector3 externalForceImpulseA = bodyAPtr->m_originalBody ? bodyAPtr->m_externalForceImpulse : btVector3(0,0,0);
							btVector3 externalTorqueImpulseA = bodyAPtr->m_originalBody ? bodyAPtr->m_externalTorqueImpulse : btVector3(0,0,0);

							btVector3 externalForceImpulseB = bodyBPtr->m_originalBody ? bodyBPtr->m_externalForceImpulse : btVector3(0,0,0);
							btVector3 externalTorqueImpulseB = bodyBPtr->m_originalBody ?bodyBPtr->m_externalTorqueImpulse : btVector3(0,0,0);

							btScalar vel1Dotn = solverConstraint.m_contactNormal1.dot(rbA.getLinearVelocity()+externalForceImpulseA)
												+ solverConstraint.m_relpos1CrossNormal.dot(rbA.getAngularVelocity()+externalTorqueImpulseA);

							btScalar vel2Dotn = solverConstraint.m_contactNormal2.dot(rbB.getLinearVelocity()+externalForceImpulseB)
																+ solverConstraint.m_relpos2CrossNormal.dot(rbB.getAngularVelocity()+externalTorqueImpulseB);

							rel_vel = vel1Dotn+vel2Dotn;
							btScalar restitution = 0.f;
							btScalar positionalError = solverConstraint.m_rhs;//already filled in by getConstraintInfo2
							btScalar	velocityError = restitution - rel_vel * info2.m_damping;
							btScalar	penetrationImpulse = positionalError*solverConstraint.m_jacDiagABInv;
							btScalar	velocityImpulse = velocityError *solverConstraint.m_jacDiagABInv;
							solverConstraint.m_rhs = penetrationImpulse+velocityImpulse;
							solverConstraint.m_appliedImpulse = 0.f;


						}
					}
				}
				currentRow+=m_tmpConstraintSizesPool[i].m_numConstraintRows;
			}
		}

		convertContacts(manifoldPtr,numManifolds,infoGlobal);

	}

//	btContactSolverInfo info = infoGlobal;


	int numNonContactPool = m_tmpSolverNonContactConstraintPool.size();
	int numConstraintPool = m_tmpSolverContactConstraintPool.size();
	int numFrictionPool = m_tmpSolverContactFrictionConstraintPool.size();

	///@todo: use stack allocator for such temporarily memory, same for solver bodies/constraints
	m_orderNonContactConstraintPool.resizeNoInitialize(numNonContactPool);
	if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
		m_orderTmpConstraintPool.resizeNoInitialize(numConstraintPool*2);
	else
		m_orderTmpConstraintPool.resizeNoInitialize(numConstraintPool);

	m_orderFrictionConstraintPool.resizeNoInitialize(numFrictionPool);
	{
		int i;
		for (i=0;i<numNonContactPool;i++)
		{
			m_orderNonContactConstraintPool[i] = i;
		}
		for (i=0;i<numConstraintPool;i++)
		{
			m_orderTmpConstraintPool[i] = i;
		}
		for (i=0;i<numFrictionPool;i++)
		{
			m_orderFrictionConstraintPool[i] = i;
		}
	}

	return 0.f;

}